

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

void __thiscall Helper::GeneratePermutedVectors(Helper *this,int n_p,int n_d,int count)

{
  vector<long,_std::allocator<long>_> *this_00;
  vector<long,std::allocator<long>> *this_01;
  uint uVar1;
  iterator iVar2;
  pointer __n;
  char cVar3;
  uint size;
  ostream *poVar4;
  ulong uVar5;
  long *plVar6;
  int k;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  pointer this_02;
  long lVar11;
  ulong uVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_7d8 [8];
  ifstream fin2;
  string local_5d0 [8];
  ifstream fin1;
  long local_3c8;
  ofstream output_file;
  ios_base aiStack_2d0 [264];
  undefined1 local_1c8 [8];
  vector<int,_std::allocator<int>_> Pi;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  long *local_e8 [2];
  long local_d8 [2];
  undefined1 auStack_c8 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  temp;
  long temp1;
  long temp2;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  R;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  
  std::ofstream::ofstream(&local_3c8);
  std::ifstream::ifstream(local_5d0);
  std::ifstream::ifstream(local_7d8);
  local_1c8 = (undefined1  [8])
              &Pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"../randoms/bob/Pi_diff_R_PA_PB.txt","");
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"../randoms/alice/Pi_diff_R_PB_PA.txt","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"../randoms/bob/Pi_diff_R_DA_DB.txt","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,"../randoms/alice/Pi_diff_R_DB_DA.txt","");
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_148,"../randoms/alice/R_PA.txt","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"../randoms/bob/R_PB.txt","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,"../randoms/alice/R_DA.txt","");
  plVar6 = local_d8;
  local_e8[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"../randoms/bob/R_DB.txt","");
  __l._M_len = 8;
  __l._M_array = (iterator)local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78,__l,(allocator_type *)&temp2);
  lVar11 = -0x100;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0);
  uVar10 = 0;
  do {
    std::ofstream::open((string *)&local_3c8,(int)(uVar10 << 5) + local_78._0_4_);
    size = n_d;
    if (uVar10 < 2) {
      size = n_p;
    }
    std::ifstream::open(local_5d0,local_78._0_4_ + 0x80);
    this_02 = (pointer)((long)local_78 + 0xa0);
    std::ifstream::open(local_7d8,(_Ios_Openmode)this_02);
    if (count != 0) {
      uVar1 = (uint)(uVar10 < 2) * 3 + 2;
      R.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(long)(int)size;
      uVar5 = (ulong)size;
      iVar8 = count;
      do {
        LoadNextRandomPermutation
                  ((vector<int,_std::allocator<int>_> *)local_1c8,(Helper *)this_02,(int)uVar10,size
                  );
        __n = R.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)&temp2,
                 (size_type)
                 R.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(allocator_type *)auStack_c8);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)auStack_c8,(size_type)__n,
                 (allocator_type *)
                 &file_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (0 < (int)size) {
          uVar12 = 0;
          uVar7 = uVar1;
          do {
            std::istream::_M_extract<long>((long *)local_5d0);
            std::istream::_M_extract<long>((long *)local_7d8);
            this_00 = (vector<long,_std::allocator<long>_> *)((long)auStack_c8 + uVar12 * 0x18);
            file_name.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)temp.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - temp1);
            iVar2._M_current =
                 (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (this_00,iVar2,
                         (long *)&file_name.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              *iVar2._M_current =
                   (long)file_name.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            uVar7 = uVar7 - 1;
          } while ((uVar7 != 0) || (uVar12 = uVar12 + 1, uVar7 = uVar1, uVar12 != uVar5));
          if (0 < (int)size) {
            uVar12 = 0;
            do {
              lVar11 = 0;
              uVar9 = (ulong)uVar1;
              do {
                this_01 = (vector<long,std::allocator<long>> *)
                          (temp2 + (long)*(int *)((long)local_1c8 + uVar12 * 4) * 0x18);
                plVar6 = (long *)((long)(((pointer)((long)auStack_c8 + uVar12 * 0x18))->
                                        super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                        super__Vector_impl_data._M_start + lVar11);
                iVar2._M_current = *(long **)(this_01 + 8);
                if (iVar2._M_current == *(long **)(this_01 + 0x10)) {
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            (this_01,iVar2,plVar6);
                }
                else {
                  *iVar2._M_current = *plVar6;
                  *(long **)(this_01 + 8) = iVar2._M_current + 1;
                }
                lVar11 = lVar11 + 8;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar5);
            if (0 < (int)size) {
              uVar12 = 0;
              do {
                uVar9 = 0;
                do {
                  poVar4 = std::ostream::_M_insert<long>((long)&local_3c8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                  uVar9 = uVar9 + 1;
                } while (uVar1 != uVar9);
                cVar3 = (char)&local_3c8;
                std::ios::widen((char)*(undefined8 *)(local_3c8 + -0x18) + cVar3);
                std::ostream::put(cVar3);
                std::ostream::flush();
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar5);
            }
          }
        }
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_3c8 + -0x18) + (char)&local_3c8);
        this_02 = (pointer)(ulong)(uint)(int)cVar3;
        std::ostream::put((char)&local_3c8);
        std::ostream::flush();
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)auStack_c8);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)&temp2);
        if (local_1c8 != (undefined1  [8])0x0) {
          this_02 = (pointer)((long)Pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)local_1c8);
          operator_delete((void *)local_1c8,(ulong)this_02);
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    std::ifstream::close();
    std::ifstream::close();
    std::ostream::flush();
    std::ofstream::close();
    uVar10 = uVar10 + 1;
  } while (uVar10 != 4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::ifstream::~ifstream(local_7d8);
  std::ifstream::~ifstream(local_5d0);
  local_3c8 = _VTT;
  *(undefined8 *)((long)&local_3c8 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&output_file);
  std::ios_base::~ios_base(aiStack_2d0);
  return;
}

Assistant:

void Helper::GeneratePermutedVectors(int n_p, int n_d, int count)
{
    std::ofstream output_file;
    std::ifstream fin1, fin2;
    std::vector<std::string> file_name = {"../randoms/bob/Pi_diff_R_PA_PB.txt", "../randoms/alice/Pi_diff_R_PB_PA.txt",
                                          "../randoms/bob/Pi_diff_R_DA_DB.txt", "../randoms/alice/Pi_diff_R_DB_DA.txt",
                                          "../randoms/alice/R_PA.txt", "../randoms/bob/R_PB.txt", "../randoms/alice/R_DA.txt", "../randoms/bob/R_DB.txt"};
    for (int i = 0; i < 4; i++)
    {
        output_file.open(file_name[i]);
        int n = (i < 2 ? n_p : n_d);
        int m = (i < 2 ? 5 : 2);
        switch (i)
        {
        case 0:
            fin1.open(file_name[4]);
            fin2.open(file_name[5]);
            break;
        case 1:
            fin1.open(file_name[5]);
            fin2.open(file_name[4]);
            break;
        case 2:
            fin1.open(file_name[6]);
            fin2.open(file_name[7]);
            break;
        case 3:
            fin1.open(file_name[7]);
            fin2.open(file_name[6]);
            break;
        default:
            break;
        }

        int l = count;
        long temp1, temp2;
        while (l--)
        {
            std::vector<int> Pi = LoadNextRandomPermutation(i, n);
            std::vector<std::vector<long>> R(n),temp(n);
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                {
                    fin1 >> temp1;
                    fin2 >> temp2;
                    temp[j].push_back(temp1-temp2);
                }
            }
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                    R[Pi[j]].push_back(temp[j][k]);
                    
            }
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                {
                   output_file<<R[j][k]<<" "; 
                }
                output_file<<std::endl;
            }
            output_file<<std::endl;
        }
        fin1.close();
        fin2.close();
        output_file.flush();
        output_file.close();
    }
}